

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

LBBox3fa * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
::vlinearBounds(LBBox3fa *__return_storage_ptr__,
               CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
               *this,size_t primID,BBox1f *time_range)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t itime;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  anon_class_16_2_07cfa4d6 local_b0;
  size_t local_a0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  local_b0.primID = &local_a0;
  fVar13 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
           super_Geometry.fnumTimeSegments;
  fVar5 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
          super_Geometry.time_range.lower;
  fVar8 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
          super_Geometry.time_range.upper - fVar5;
  fVar10 = (time_range->lower - fVar5) / fVar8;
  fVar8 = (time_range->upper - fVar5) / fVar8;
  fVar4 = fVar13 * fVar10;
  fVar17 = fVar13 * fVar8;
  local_b0.this = this;
  local_a0 = primID;
  fVar5 = floorf(fVar4);
  fVar6 = ceilf(fVar17);
  iVar2 = (int)fVar5;
  if (fVar5 <= 0.0) {
    fVar5 = 0.0;
  }
  fVar14 = fVar6;
  if (fVar13 <= fVar6) {
    fVar14 = fVar13;
  }
  iVar3 = -1;
  if (-1 < iVar2) {
    iVar3 = iVar2;
  }
  iVar1 = (int)fVar13 + 1;
  if ((int)fVar6 < (int)fVar13 + 1) {
    iVar1 = (int)fVar6;
  }
  linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_b0,(long)(int)fVar5);
  linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_b0,(long)(int)fVar14);
  if (iVar1 - iVar3 == 1) {
    fVar4 = fVar4 - fVar5;
    if (fVar4 <= 0.0) {
      fVar4 = 0.0;
    }
    fVar13 = 1.0 - fVar4;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] =
         fVar13 * blower0.lower.field_0.m128[0] + fVar4 * bupper1.lower.field_0.m128[0];
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] =
         fVar13 * blower0.lower.field_0.m128[1] + fVar4 * bupper1.lower.field_0.m128[1];
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] =
         fVar13 * blower0.lower.field_0.m128[2] + fVar4 * bupper1.lower.field_0.m128[2];
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] =
         fVar13 * blower0.lower.field_0.m128[3] + fVar4 * bupper1.lower.field_0.m128[3];
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] =
         fVar13 * blower0.upper.field_0.m128[0] + fVar4 * bupper1.upper.field_0.m128[0];
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] =
         fVar13 * blower0.upper.field_0.m128[1] + fVar4 * bupper1.upper.field_0.m128[1];
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] =
         fVar13 * blower0.upper.field_0.m128[2] + fVar4 * bupper1.upper.field_0.m128[2];
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] =
         fVar13 * blower0.upper.field_0.m128[3] + fVar4 * bupper1.upper.field_0.m128[3];
    fVar14 = fVar14 - fVar17;
    if (fVar14 <= 0.0) {
      fVar14 = 0.0;
    }
    fVar13 = 1.0 - fVar14;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[0] =
         bupper1.lower.field_0.m128[0] * fVar13 + blower0.lower.field_0.m128[0] * fVar14;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[1] =
         bupper1.lower.field_0.m128[1] * fVar13 + blower0.lower.field_0.m128[1] * fVar14;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[2] =
         bupper1.lower.field_0.m128[2] * fVar13 + blower0.lower.field_0.m128[2] * fVar14;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[3] =
         bupper1.lower.field_0.m128[3] * fVar13 + blower0.lower.field_0.m128[3] * fVar14;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[0] =
         fVar13 * bupper1.upper.field_0.m128[0] + fVar14 * blower0.upper.field_0.m128[0];
    (__return_storage_ptr__->bounds1).upper.field_0.m128[1] =
         fVar13 * bupper1.upper.field_0.m128[1] + fVar14 * blower0.upper.field_0.m128[1];
    (__return_storage_ptr__->bounds1).upper.field_0.m128[2] =
         fVar13 * bupper1.upper.field_0.m128[2] + fVar14 * blower0.upper.field_0.m128[2];
    (__return_storage_ptr__->bounds1).upper.field_0.m128[3] =
         fVar13 * bupper1.upper.field_0.m128[3] + fVar14 * blower0.upper.field_0.m128[3];
  }
  else {
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower1,&local_b0,(long)((int)fVar5 + 1));
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper0,&local_b0,(long)((int)fVar14 + -1));
    fVar4 = fVar4 - fVar5;
    if (fVar4 <= 0.0) {
      fVar4 = 0.0;
    }
    fVar5 = 1.0 - fVar4;
    fVar22 = blower0.lower.field_0.m128[0] * fVar5 + blower1.lower.field_0.m128[0] * fVar4;
    fVar23 = blower0.lower.field_0.m128[1] * fVar5 + blower1.lower.field_0.m128[1] * fVar4;
    fVar24 = blower0.lower.field_0.m128[2] * fVar5 + blower1.lower.field_0.m128[2] * fVar4;
    fVar25 = blower0.lower.field_0.m128[3] * fVar5 + blower1.lower.field_0.m128[3] * fVar4;
    fVar6 = fVar5 * blower0.upper.field_0.m128[0] + fVar4 * blower1.upper.field_0.m128[0];
    fVar11 = fVar5 * blower0.upper.field_0.m128[1] + fVar4 * blower1.upper.field_0.m128[1];
    fVar12 = fVar5 * blower0.upper.field_0.m128[2] + fVar4 * blower1.upper.field_0.m128[2];
    fVar5 = fVar5 * blower0.upper.field_0.m128[3] + fVar4 * blower1.upper.field_0.m128[3];
    fVar14 = fVar14 - fVar17;
    if (fVar14 <= 0.0) {
      fVar14 = 0.0;
    }
    fVar4 = 1.0 - fVar14;
    fVar18 = bupper1.lower.field_0.m128[0] * fVar4 + bupper0.lower.field_0.m128[0] * fVar14;
    fVar19 = bupper1.lower.field_0.m128[1] * fVar4 + bupper0.lower.field_0.m128[1] * fVar14;
    fVar20 = bupper1.lower.field_0.m128[2] * fVar4 + bupper0.lower.field_0.m128[2] * fVar14;
    fVar21 = bupper1.lower.field_0.m128[3] * fVar4 + bupper0.lower.field_0.m128[3] * fVar14;
    fVar17 = fVar4 * bupper1.upper.field_0.m128[0] + fVar14 * bupper0.upper.field_0.m128[0];
    fVar15 = fVar4 * bupper1.upper.field_0.m128[1] + fVar14 * bupper0.upper.field_0.m128[1];
    fVar16 = fVar4 * bupper1.upper.field_0.m128[2] + fVar14 * bupper0.upper.field_0.m128[2];
    fVar4 = fVar4 * bupper1.upper.field_0.m128[3] + fVar14 * bupper0.upper.field_0.m128[3];
    iVar3 = -1;
    if (-1 < iVar2) {
      iVar3 = iVar2;
    }
    itime = (size_t)iVar3;
    while (itime = itime + 1, (long)itime < (long)iVar1) {
      fVar14 = ((float)(int)itime / fVar13 - fVar10) / (fVar8 - fVar10);
      fVar26 = 1.0 - fVar14;
      linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_b0,itime);
      auVar7._0_4_ = bi.lower.field_0.m128[0] - (fVar22 * fVar26 + fVar18 * fVar14);
      auVar7._4_4_ = bi.lower.field_0.m128[1] - (fVar23 * fVar26 + fVar19 * fVar14);
      auVar7._8_4_ = bi.lower.field_0.m128[2] - (fVar24 * fVar26 + fVar20 * fVar14);
      auVar7._12_4_ = bi.lower.field_0.m128[3] - (fVar25 * fVar26 + fVar21 * fVar14);
      auVar9._0_4_ = bi.upper.field_0.m128[0] - (fVar26 * fVar6 + fVar14 * fVar17);
      auVar9._4_4_ = bi.upper.field_0.m128[1] - (fVar26 * fVar11 + fVar14 * fVar15);
      auVar9._8_4_ = bi.upper.field_0.m128[2] - (fVar26 * fVar12 + fVar14 * fVar16);
      auVar9._12_4_ = bi.upper.field_0.m128[3] - (fVar26 * fVar5 + fVar14 * fVar4);
      auVar7 = minps(auVar7,ZEXT816(0));
      auVar9 = maxps(auVar9,ZEXT816(0));
      fVar22 = fVar22 + auVar7._0_4_;
      fVar23 = fVar23 + auVar7._4_4_;
      fVar24 = fVar24 + auVar7._8_4_;
      fVar25 = fVar25 + auVar7._12_4_;
      fVar18 = fVar18 + auVar7._0_4_;
      fVar19 = fVar19 + auVar7._4_4_;
      fVar20 = fVar20 + auVar7._8_4_;
      fVar21 = fVar21 + auVar7._12_4_;
      fVar6 = fVar6 + auVar9._0_4_;
      fVar11 = fVar11 + auVar9._4_4_;
      fVar12 = fVar12 + auVar9._8_4_;
      fVar5 = fVar5 + auVar9._12_4_;
      fVar17 = fVar17 + auVar9._0_4_;
      fVar15 = fVar15 + auVar9._4_4_;
      fVar16 = fVar16 + auVar9._8_4_;
      fVar4 = fVar4 + auVar9._12_4_;
    }
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] = fVar22;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] = fVar23;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] = fVar24;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] = fVar25;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] = fVar6;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] = fVar11;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] = fVar12;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] = fVar5;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[0] = fVar18;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[1] = fVar19;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[2] = fVar20;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[3] = fVar21;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[0] = fVar17;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[1] = fVar15;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[2] = fVar16;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[3] = fVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(size_t primID, const BBox1f& time_range) const {
        return linearBounds(primID,time_range);
      }